

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psobjs.c
# Opt level: O0

FT_Error ps_builder_add_point1(PS_Builder *builder,FT_Pos x,FT_Pos y)

{
  FT_Error FVar1;
  FT_Error error;
  FT_Pos y_local;
  FT_Pos x_local;
  PS_Builder *builder_local;
  
  FVar1 = ps_builder_check_points(builder,1);
  if (FVar1 == 0) {
    ps_builder_add_point(builder,x,y,'\x01');
  }
  return FVar1;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  ps_builder_add_point1( PS_Builder*  builder,
                         FT_Pos       x,
                         FT_Pos       y )
  {
    FT_Error  error;


    error = ps_builder_check_points( builder, 1 );
    if ( !error )
      ps_builder_add_point( builder, x, y, 1 );

    return error;
  }